

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util_test.cc
# Opt level: O1

void anon_unknown.dwarf_4643::Test_TemplateUtilTest_InitStaticTemplateStringForTest::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  TemplateId TVar6;
  undefined8 extraout_RAX;
  TemplateDictionaryPeer peer;
  TemplateDictionary dict;
  UnsafeArena arena;
  TemplateString local_260;
  char *local_240;
  undefined8 uStack_238;
  undefined1 local_230;
  undefined7 uStack_22f;
  undefined8 uStack_228;
  char *local_220;
  size_t sStack_218;
  undefined1 local_210;
  undefined7 uStack_20f;
  TemplateId TStack_208;
  TemplateDictionaryPeer local_200;
  bool *local_1f8;
  long local_1f0;
  undefined1 local_1e8;
  undefined8 local_1e0;
  undefined **local_188 [45];
  
  ctemplate::BaseArena::BaseArena((BaseArena *)local_188,(char *)0x0,0x400,false);
  local_188[0] = &PTR__BaseArena_0010dcb8;
  local_260.is_immutable_ = true;
  local_260._17_3_ = 0x554c41;
  local_260._20_2_ = 0x45;
  local_260.length_ = 5;
  local_260.ptr_ = &local_260.is_immutable_;
  pcVar5 = (char *)ctemplate::BaseArena::GetMemory((BaseArena *)local_188,5,1);
  sVar3 = local_260.length_;
  pcVar5[4] = local_260._20_1_;
  pcVar5[0] = local_260.is_immutable_;
  pcVar5[1] = local_260._17_1_;
  pcVar5[2] = local_260._18_1_;
  pcVar5[3] = local_260._19_1_;
  local_1f0 = (long)(int)local_260.length_;
  local_1f8 = (bool *)local_260.ptr_;
  local_1e8 = local_260.ptr_ < &data_start && &UNK_00105edf < local_260.ptr_;
  local_1e0 = 0;
  TVar6 = ctemplate::TemplateString::GetGlobalId();
  if ((bool *)local_260.ptr_ != &local_260.is_immutable_) {
    operator_delete(local_260.ptr_);
  }
  local_260.ptr_ = "test_GetSectionValue";
  local_260.length_ = 0x14;
  local_260.is_immutable_ = true;
  local_260.id_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary
            ((TemplateDictionary *)&local_1f8,&local_260,(UnsafeArena *)0x0);
  sStack_218 = sVar3;
  local_210 = 1;
  local_240 = "value";
  uStack_238 = 5;
  local_230 = 1;
  uStack_228 = 0;
  TVar2._17_7_ = uStack_22f;
  TVar2.is_immutable_ = true;
  TVar1._17_7_ = uStack_20f;
  TVar1.is_immutable_ = true;
  TVar1.length_ = sVar3;
  TVar1.ptr_ = pcVar5;
  TVar1.id_ = TVar6;
  TVar2.length_ = 5;
  TVar2.ptr_ = "value";
  TVar2.id_ = 0;
  local_220 = pcVar5;
  TStack_208 = TVar6;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar2);
  local_260.is_immutable_ = true;
  local_260.ptr_ = pcVar5;
  local_260.length_ = sVar3;
  local_260.id_ = TVar6;
  local_200.dict_ = (TemplateDictionary *)&local_1f8;
  pcVar5 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_200,&local_260);
  iVar4 = strcmp("value",pcVar5);
  if (iVar4 == 0) {
    ctemplate::TemplateDictionary::~TemplateDictionary((TemplateDictionary *)&local_1f8);
    ctemplate::BaseArena::~BaseArena((BaseArena *)local_188);
    return;
  }
  _GLOBAL__N_1::Test_TemplateUtilTest_InitStaticTemplateStringForTest::Run();
  ctemplate::TemplateDictionary::~TemplateDictionary((TemplateDictionary *)&local_1f8);
  ctemplate::BaseArena::~BaseArena((BaseArena *)local_188);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(TemplateUtilTest, InitStaticTemplateStringForTest) {
  UnsafeArena arena(1024);
  StaticTemplateString kValue = GetTestTemplateString(&arena);

  TemplateDictionary dict("test_GetSectionValue");
  dict.SetValue(kValue, "value");

  TemplateDictionaryPeer peer(&dict);
  EXPECT_STREQ("value", peer.GetSectionValue(kValue));
}